

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.cpp
# Opt level: O2

int __thiscall merlin::cte::init(cte *this,EVP_PKEY_CTX *ctx)

{
  variable_order_t *order;
  pointer pmVar1;
  pointer pmVar2;
  pointer ppeVar3;
  edge *peVar4;
  pointer pmVar5;
  pointer pmVar6;
  int extraout_EAX;
  ostream *poVar7;
  pointer puVar8;
  pointer puVar9;
  ulong uVar10;
  size_t i_1;
  long lVar11;
  ulong uVar12;
  size_t i;
  ulong uVar13;
  pointer pfVar14;
  double dVar15;
  double dVar16;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> fin;
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  clusters;
  variable_set scope;
  graph g;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> local_1b8;
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  local_1a0;
  factor local_188;
  graph local_120;
  undefined8 *local_50;
  char *local_48;
  undefined8 *local_40;
  char *local_38;
  
  if (0 < this->m_verbose) {
    poVar7 = std::operator<<((ostream *)&std::cout,"[CTE] + inference task   : ");
    poVar7 = operator<<(poVar7,&this->m_task);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  puVar8 = (this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar9 = (this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (puVar8 != puVar9) {
    if (0 < this->m_verbose) {
      std::operator<<((ostream *)&std::cout,"[CTE] + query vars       : ");
      local_40 = &std::cout;
      local_38 = " ";
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::ostream_iterator<unsigned_long,char,std::char_traits<char>>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )&local_120,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *)
                 (this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      puVar8 = (this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar9 = (this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    if ((ulong)((long)puVar9 - (long)puVar8) < 0x30) {
      local_188.v_.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.v_.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188.v_.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188._vptr_factor = (_func_int **)0x0;
      local_188.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      for (uVar13 = 0; uVar13 < (ulong)((long)puVar9 - (long)puVar8 >> 3); uVar13 = uVar13 + 1) {
        local_120.m_adj.
        super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar8[uVar13];
        dVar15 = (this->m_gmo).m_dims.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(long)local_120.m_adj.
                        super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                        ._M_impl.super__Vector_impl_data._M_start];
        uVar10 = (ulong)dVar15;
        local_120.m_adj.
        super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)(dVar15 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10);
        variable_set::operator|=((variable_set *)&local_188,(variable *)&local_120);
        puVar8 = (this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar9 = (this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      factor::factor((factor *)&local_120,(variable_set *)&local_188,1.0);
      graphical_model::add_factor(&this->m_gmo,(factor *)&local_120);
      factor::~factor((factor *)&local_120);
      variable_set::~variable_set((variable_set *)&local_188);
    }
  }
  order = &this->m_order;
  if ((this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    graphical_model::order
              ((variable_order_t *)&local_120,&this->m_gmo,(OrderMethod)(this->m_order_method).t_);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(order,&local_120);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_120);
  }
  if (0 < this->m_verbose) {
    poVar7 = std::operator<<((ostream *)&std::cout,"[CTE] + ordering method  : ");
    poVar7 = operator<<(poVar7,&this->m_order_method);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::operator<<((ostream *)&std::cout,"[CTE] + elimination      : ");
    local_50 = &std::cout;
    local_48 = " ";
    std::
    copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::ostream_iterator<unsigned_long,char,std::char_traits<char>>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )&local_120,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *)
               (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    graphical_model::induced_width(&this->m_gmo,order);
    poVar7 = std::operator<<((ostream *)&std::cout,"[CTE] + induced width    : ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"[CTE] + exact inference  : Yes");
    std::endl<char,std::char_traits<char>>(poVar7);
    std::operator<<((ostream *)&std::cout,"[CTE] + ordering time    : ");
    dVar15 = timeSystem();
    poVar7 = std::ostream::_M_insert<double>(dVar15 - (this->super_algorithm).m_start_time);
    poVar7 = std::operator<<(poVar7," seconds");
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"[CTE] Building clique tree ... ");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  pmVar1 = (this->m_gmo).super_graph.m_adj.
           super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pmVar2 = (this->m_gmo).super_graph.m_adj.
           super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1b8.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (pfVar14 = (this->m_gmo).m_factors.
                 super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pfVar14 !=
      (this->m_gmo).m_factors.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
      _M_impl.super__Vector_impl_data._M_finish; pfVar14 = pfVar14 + 1) {
    std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::push_back
              (&local_1b8,&pfVar14->v_);
  }
  graph::graph(&local_120,(long)pmVar1 - (long)pmVar2 >> 5);
  graph::init(&local_120,(EVP_PKEY_CTX *)&local_1b8);
  graph::triangulate(&local_120,order);
  graph::maximal_cliques(&local_1a0,&local_120,order);
  build_clique_tree(this,&local_1a0);
  if (0 < this->m_verbose) {
    poVar7 = std::operator<<((ostream *)&std::cout,"[CTE] Created clique tree with ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7," clique factors");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  ppeVar3 = (this->m_edges).
            super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar13 = 0;
  uVar10 = 0;
  for (lVar11 = 0;
      (long)(this->m_edges).
            super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3 != lVar11;
      lVar11 = lVar11 + 1) {
    peVar4 = ppeVar3[lVar11];
    uVar12 = (long)*(pointer *)
                    ((long)&(peVar4->first->clique).m_v.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) -
             *(long *)&(peVar4->first->clique).m_v.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl >>
             3;
    if (uVar12 < uVar10) {
      uVar12 = uVar10;
    }
    uVar10 = (long)*(pointer *)
                    ((long)&(peVar4->second->clique).m_v.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) -
             *(long *)&(peVar4->second->clique).m_v.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl >>
             3;
    if (uVar10 < uVar12) {
      uVar10 = uVar12;
    }
    uVar12 = (long)*(pointer *)
                    ((long)&(peVar4->sepset).m_v.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) -
             *(long *)&(peVar4->sepset).m_v.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> >> 3;
    if (uVar13 <= uVar12) {
      uVar13 = uVar12;
    }
  }
  this->m_logz = 0.0;
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::clear(&this->m_beliefs);
  pmVar5 = (this->m_gmo).m_vadj.
           super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pmVar6 = (this->m_gmo).m_vadj.
           super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  factor::factor(&local_188,1.0);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::resize
            (&this->m_beliefs,(long)pmVar6 - (long)pmVar5 >> 5,&local_188);
  factor::~factor(&local_188);
  if (0 < this->m_verbose) {
    dVar16 = timeSystem();
    dVar15 = (this->super_algorithm).m_start_time;
    poVar7 = std::operator<<((ostream *)&std::cout,"[CTE] Number of cliques  : ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"[CTE] Number of edges    : ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"[CTE] Max clique size    : ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<((ostream *)&std::cout,"[CTE] Max separator size : ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::operator<<((ostream *)&std::cout,"[CTE] Finished initialization in ");
    poVar7 = std::ostream::_M_insert<double>(dVar16 - dVar15);
    poVar7 = std::operator<<(poVar7," seconds");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  std::
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_1a0);
  graph::~graph(&local_120);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&local_1b8);
  return extraout_EAX;
}

Assistant:

void cte::init() {

	// Prologue
	if (m_verbose > 0) {
		std::cout << "[CTE] + inference task   : " << m_task << std::endl;
	}

	if (m_query.empty() == false) {
		if (m_verbose > 0) {
			std::cout << "[CTE] + query vars       : ";
			std::copy(m_query.begin(), m_query.end(), std::ostream_iterator<vindex>(std::cout, " "));
			std::cout << std::endl;
		}

		// Add a dummy factor over the query variables
		if (m_query.size() <= MERLIN_MAXSIZE_JOINT_MARGINAL) {
			variable_set scope;
			for (size_t i = 0; i < m_query.size(); ++i) {
				scope |= m_gmo.var(m_query[i]);
			}

			factor q(scope, 1.0);
			m_gmo.add_factor(q);
		}
	}

	if (m_order.size() == 0) { // if we need to construct an elimination ordering
		m_order = m_gmo.order(m_order_method);
	}


	if (m_verbose > 0) {
		std::cout << "[CTE] + ordering method  : " << m_order_method << std::endl;
		std::cout << "[CTE] + elimination      : ";
		std::copy(m_order.begin(), m_order.end(),
				std::ostream_iterator<size_t>(std::cout, " "));
		std::cout << std::endl;

		// Calculate the induced width of the elimination ordering
		size_t wstar = m_gmo.induced_width(m_order);
		std::cout << "[CTE] + induced width    : " << wstar << std::endl;
		std::cout << "[CTE] + exact inference  : Yes" << std::endl;
		std::cout << "[CTE] + ordering time    : " << (timeSystem() - m_start_time) << " seconds" << std::endl;
		std::cout << "[CTE] Building clique tree ... " << std::endl;
	}

	// Get the factors scopes
	size_t n = m_gmo.num_nodes();
	std::vector<variable_set> fin;
	for (std::vector<factor>::const_iterator i = m_gmo.get_factors().begin();
			i != m_gmo.get_factors().end(); ++i) {
		fin.push_back((*i).vars());
	}

	// Create the graph
	graph g(n);
	g.init(fin);

	// Triangulate the graph
	g.triangulate(m_order);

	// Find the maximal cliques
	std::vector<std::set<size_t> > clusters = g.maximal_cliques(m_order);

	// Build the clique tree
	build_clique_tree(clusters);

	if (m_verbose > 0) {
		std::cout << "[CTE] Created clique tree with " << m_clusters.size()
				<< " clique factors" << std::endl;
	}

	size_t max_clique_size = 0, max_sepset_size = 0;
	for (size_t i = 0; i < m_edges.size(); ++i) {
		detail::edge* e = m_edges[i];
		max_clique_size = std::max(max_clique_size, e->first->clique.size());
		max_clique_size = std::max(max_clique_size, e->second->clique.size());
		max_sepset_size = std::max(max_sepset_size, e->sepset.size());
	}

	// Initialize beliefs (marginals)
	m_logz = 0;
	m_beliefs.clear();
	m_beliefs.resize(m_gmo.nvar(), factor(1.0));

	// Output the bucket tree statistics
	if (m_verbose > 0) {
		double elapsed = (timeSystem() - m_start_time);
		std::cout << "[CTE] Number of cliques  : " << m_clusters.size() << std::endl;
		std::cout << "[CTE] Number of edges    : " << m_edges.size() << std::endl;
		std::cout << "[CTE] Max clique size    : " << max_clique_size << std::endl;
		std::cout << "[CTE] Max separator size : " << max_sepset_size << std::endl;
		std::cout << "[CTE] Finished initialization in " << elapsed << " seconds" << std::endl;
	}
}